

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseHelper_Group_Begin(X3DImporter *this,bool pStatic)

{
  CX3DImporter_NodeElement_Group *this_00;
  CX3DImporter_NodeElement_Group *local_20;
  
  this_00 = (CX3DImporter_NodeElement_Group *)operator_new(0x98);
  CX3DImporter_NodeElement_Group::CX3DImporter_NodeElement_Group
            (this_00,this->NodeElement_Cur,pStatic);
  if (this->NodeElement_Cur != (CX3DImporter_NodeElement *)0x0) {
    local_20 = this_00;
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&local_20);
  }
  local_20 = this_00;
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
  push_back(&this->NodeElement_List,(value_type *)&local_20);
  this->NodeElement_Cur = (CX3DImporter_NodeElement *)this_00;
  return;
}

Assistant:

void X3DImporter::ParseHelper_Group_Begin(const bool pStatic)
{
    CX3DImporter_NodeElement_Group* new_group = new CX3DImporter_NodeElement_Group(NodeElement_Cur, pStatic);// create new node with current node as parent.

	// if we are adding not the root element then add new element to current element child list.
    if ( NodeElement_Cur != nullptr )
    {
        NodeElement_Cur->Child.push_back( new_group );
    }

	NodeElement_List.push_back(new_group);// it's a new element - add it to list.
	NodeElement_Cur = new_group;// switch current element to new one.
}